

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_Pause(FACTAudioEngine *pEngine,uint16_t nCategory,int32_t fPause)

{
  LinkedList *pLVar1;
  uint8_t uVar2;
  LinkedList **ppLVar3;
  FACTCue *pCue;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  ppLVar3 = &pEngine->sbList;
  while (pLVar1 = *ppLVar3, pLVar1 != (LinkedList *)0x0) {
    pCue = (FACTCue *)pLVar1->entry;
    while (pCue = pCue->next, pCue != (FACTCue *)0x0) {
      if (pCue->playingSound != (FACTSoundInstance *)0x0) {
        uVar2 = FACT_INTERNAL_IsInCategory(pEngine,nCategory,pCue->playingSound->sound->category);
        if (uVar2 != '\0') {
          FACTCue_Pause(pCue,fPause);
        }
      }
    }
    ppLVar3 = &pLVar1->next;
  }
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_Pause(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	int32_t fPause
) {
	FACTCue *cue;
	LinkedList *list;

	FAudio_PlatformLockMutex(pEngine->apiLock);
	list = pEngine->sbList;
	while (list != NULL)
	{
		cue = ((FACTSoundBank*) list->entry)->cueList;
		while (cue != NULL)
		{
			if (	cue->playingSound != NULL &&
				FACT_INTERNAL_IsInCategory(
					pEngine,
					nCategory,
					cue->playingSound->sound->category
				)	)
			{
				FACTCue_Pause(cue, fPause);
			}
			cue = cue->next;
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}